

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

size_t robin_hood::hash_int(uint64_t x)

{
  unsigned_long uVar1;
  unsigned_long h;
  unsigned_long h2;
  unsigned_long h1;
  uint64_t x_local;
  
  uVar1 = detail::rotr<unsigned_long>(x,0x20);
  uVar1 = detail::rotr<unsigned_long>(x * -0x5db4512b69c11bf9 + uVar1 * -0x604de39ae16720db,0x20);
  return uVar1;
}

Assistant:

inline size_t hash_int(uint64_t x) noexcept {
    // inspired by lemire's strongly universal hashing
    // https://lemire.me/blog/2018/08/15/fast-strongly-universal-64-bit-hashing-everywhere/
    //
    // Instead of shifts, we use rotations so we don't lose any bits.
    //
    // Added a final multiplcation with a constant for more mixing. It is most important that
    // the lower bits are well mixed.
    auto h1 = x * UINT64_C(0xA24BAED4963EE407);
    auto h2 = detail::rotr(x, 32U) * UINT64_C(0x9FB21C651E98DF25);
    auto h = detail::rotr(h1 + h2, 32U);
    return static_cast<size_t>(h);
}